

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

uint32_t spvtools::val::anon_unknown_0::getSize
                   (uint32_t member_id,LayoutConstraints *inherited,MemberConstraints *constraints,
                   ValidationState_t *vstate)

{
  uint16_t uVar1;
  uint uVar2;
  pointer puVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  const_iterator cVar13;
  mapped_type *inherited_00;
  int iVar14;
  _Rb_tree_color _Var15;
  _Rb_tree_color _Var16;
  FieldDecorationsIter FVar17;
  void *local_58;
  void *pvStack_50;
  long local_48;
  key_type local_38;
  
  iVar14 = 1;
  while( true ) {
    pIVar9 = ValidationState_t::FindDef(vstate,member_id);
    uVar1 = (pIVar9->inst_).opcode;
    if (uVar1 != 0x17) break;
    puVar3 = (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    member_id = puVar3[2];
    iVar14 = iVar14 * puVar3[3];
  }
  switch(uVar1) {
  case 0x15:
  case 0x16:
    uVar6 = (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start[2];
    goto LAB_001c1954;
  case 0x17:
  case 0x1f:
switchD_001c1927_caseD_17:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x16f,
                  "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                 );
  case 0x18:
    puVar3 = (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = puVar3[3];
    if (inherited->majorness == kColumnMajor) {
      uVar8 = uVar6 * inherited->matrix_stride;
    }
    else {
      pIVar9 = ValidationState_t::FindDef(vstate,puVar3[2]);
      puVar3 = (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = puVar3[3];
      uVar8 = getSize(puVar3[2],inherited,constraints,vstate);
      uVar8 = uVar8 * uVar6 + (uVar2 - 1) * inherited->matrix_stride;
    }
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
    bVar5 = EnumSet<spv::Capability>::contains(&vstate->module_capabilities_,BindlessTextureNV);
    if (!bVar5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0x128,
                    "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    uVar6 = ValidationState_t::samplerimage_variable_address_mode(vstate);
LAB_001c1954:
    uVar8 = uVar6 >> 3;
    break;
  case 0x1c:
    pIVar10 = ValidationState_t::FindDef
                        (vstate,(pIVar9->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[3]);
    iVar7 = spvOpcodeIsSpecConstant((uint)(pIVar10->inst_).opcode);
    uVar8 = 0;
    if (iVar7 == 0) {
      if ((pIVar10->inst_).opcode != 0x2b) {
        __assert_fail("spv::Op::OpConstant == sizeInst->opcode()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x138,
                      "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      uVar6 = (pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[3];
      uVar8 = getSize((pIVar9->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2],inherited,constraints,vstate);
      local_58 = (void *)CONCAT44(local_58._4_4_,member_id);
      pmVar11 = std::
                map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                ::operator[](&vstate->id_decorations_,(key_type_conflict *)&local_58);
      _Var16 = _S_red;
      for (p_Var12 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        if (p_Var12[1]._M_color == 6) {
          _Var16 = (p_Var12[1]._M_parent)->_M_color;
          break;
        }
      }
      uVar8 = _Var16 * (uVar6 - 1) + uVar8;
    }
    break;
  case 0x1d:
    uVar8 = 0;
    break;
  case 0x1e:
    pIVar9 = ValidationState_t::FindDef(vstate,member_id);
    local_58 = (void *)0x0;
    pvStack_50 = (void *)0x0;
    local_48 = 0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
               (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 2,
               (pIVar9->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    pvVar4 = pvStack_50;
    if (local_58 == pvStack_50) {
      uVar8 = 0;
    }
    else {
      _Var16 = (int)((ulong)((long)pvStack_50 - (long)local_58) >> 2) - _S_black;
      FVar17 = ValidationState_t::id_member_decorations(vstate,member_id,_Var16);
      cVar13 = FVar17.begin._M_node;
      if (cVar13._M_node == FVar17.end._M_node._M_node) {
        _Var15 = ~_S_red;
      }
      else {
        _Var15 = ~_S_red;
        do {
          if (cVar13._M_node[2]._M_color != _Var16) {
            __assert_fail("decoration->struct_member_index() == (int)lastIdx",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x160,
                          "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                         );
          }
          if (cVar13._M_node[1]._M_color == 0x23) {
            _Var15 = (cVar13._M_node[1]._M_parent)->_M_color;
          }
          cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
        } while (cVar13._M_node != FVar17.end._M_node._M_node);
      }
      if (_Var15 == ~_S_red) {
        __assert_fail("offset != 0xffffffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x167,
                      "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      local_38.second = _Var16;
      local_38.first = *(uint *)((long)pvVar4 + -4);
      inherited_00 = std::
                     unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                     ::operator[](constraints,&local_38);
      uVar8 = getSize(*(uint32_t *)((long)pvVar4 + -4),inherited_00,constraints,vstate);
      uVar8 = uVar8 + _Var15;
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
    break;
  case 0x20:
    goto switchD_001c1927_caseD_20;
  default:
    if (uVar1 != 0x1141) goto switchD_001c1927_caseD_17;
    goto switchD_001c1927_caseD_20;
  }
LAB_001c1b86:
  return iVar14 * uVar8;
switchD_001c1927_caseD_20:
  uVar8 = vstate->pointer_size_and_alignment_;
  goto LAB_001c1b86;
}

Assistant:

uint32_t getSize(uint32_t member_id, const LayoutConstraints& inherited,
                 MemberConstraints& constraints, ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(member_id);
  const auto& words = inst->words();
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      return words[2] / 8;
    case spv::Op::OpTypeVector: {
      const auto componentId = words[2];
      const auto numComponents = words[3];
      const auto componentSize =
          getSize(componentId, inherited, constraints, vstate);
      const auto size = componentSize * numComponents;
      return size;
    }
    case spv::Op::OpTypeArray: {
      const auto sizeInst = vstate.FindDef(words[3]);
      if (spvOpcodeIsSpecConstant(sizeInst->opcode())) return 0;
      assert(spv::Op::OpConstant == sizeInst->opcode());
      const uint32_t num_elem = sizeInst->words()[3];
      const uint32_t elem_type = words[2];
      const uint32_t elem_size =
          getSize(elem_type, inherited, constraints, vstate);
      // Account for gaps due to alignments in the first N-1 elements,
      // then add the size of the last element.
      const auto size =
          (num_elem - 1) * GetArrayStride(member_id, vstate) + elem_size;
      return size;
    }
    case spv::Op::OpTypeRuntimeArray:
      return 0;
    case spv::Op::OpTypeMatrix: {
      const auto num_columns = words[3];
      if (inherited.majorness == kColumnMajor) {
        return num_columns * inherited.matrix_stride;
      } else {
        // Row major case.
        const auto column_type = words[2];
        const auto component_inst = vstate.FindDef(column_type);
        const auto num_rows = component_inst->words()[3];
        const auto scalar_elem_type = component_inst->words()[2];
        const uint32_t scalar_elem_size =
            getSize(scalar_elem_type, inherited, constraints, vstate);
        return (num_rows - 1) * inherited.matrix_stride +
               num_columns * scalar_elem_size;
      }
    }
    case spv::Op::OpTypeStruct: {
      const auto& members = getStructMembers(member_id, vstate);
      if (members.empty()) return 0;
      const auto lastIdx = uint32_t(members.size() - 1);
      const auto& lastMember = members.back();
      uint32_t offset = 0xffffffff;
      // Find the offset of the last element and add the size.
      auto member_decorations =
          vstate.id_member_decorations(member_id, lastIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)lastIdx);
        if (spv::Decoration::Offset == decoration->dec_type()) {
          offset = decoration->params()[0];
        }
      }
      // This check depends on the fact that all members have offsets.  This
      // has been checked earlier in the flow.
      assert(offset != 0xffffffff);
      const auto& constraint = constraints[std::make_pair(lastMember, lastIdx)];
      return offset + getSize(lastMember, constraint, constraints, vstate);
    }
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      return vstate.pointer_size_and_alignment();
    default:
      assert(0);
      return 0;
  }
}